

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteConvenienceRules
          (cmGlobalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *emitted)

{
  pointer puVar1;
  pointer puVar2;
  pointer pcVar3;
  long *plVar4;
  __uniq_ptr_data<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>,_true,_true> this_00;
  pointer pbVar5;
  pointer pbVar6;
  bool bVar7;
  bool bVar8;
  TargetType TVar9;
  pointer puVar10;
  string *psVar11;
  ostream *poVar12;
  pointer pbVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  pointer puVar15;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar16;
  undefined1 local_198 [32];
  cmLocalUnixMakefileGenerator3 *local_178;
  ostream *local_170;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string localName;
  string makeTargetName;
  string makefileName;
  string local_a0;
  string local_80;
  string tmp;
  
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198._0_8_ = local_198 + 0x10;
  local_170 = ruleFileStream;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_198,"CMAKE_SUPPRESS_REGENERATION","");
  bVar7 = cmGlobalGenerator::GlobalSettingIsOn((cmGlobalGenerator *)this,(string *)local_198);
  if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
    operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
  }
  if (!bVar7) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[25]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
               (char (*) [25])"cmake_check_build_system");
  }
  puVar10 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
            super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar10 != puVar1) {
    do {
      local_178 = (cmLocalUnixMakefileGenerator3 *)
                  (puVar10->_M_t).
                  super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                  .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
      puVar2 = *(pointer *)
                &((GeneratorTargetVector *)((long)&local_178->super_cmLocalCommonGenerator + 0x150))
                 ->
                 super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
      ;
      for (puVar15 = *(pointer *)
                      &((GeneratorTargetVector *)
                       ((long)&local_178->super_cmLocalCommonGenerator + 0x148))->
                       super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
          ; puVar15 != puVar2; puVar15 = puVar15 + 1) {
        psVar11 = cmGeneratorTarget::GetName_abi_cxx11_
                            ((cmGeneratorTarget *)
                             (puVar15->_M_t).
                             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                            );
        pcVar3 = (psVar11->_M_dataplus)._M_p;
        name._M_dataplus._M_p = (pointer)&name.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&name,pcVar3,pcVar3 + psVar11->_M_string_length);
        if (name._M_string_length != 0) {
          pVar16 = std::
                   _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   ::_M_insert_unique<std::__cxx11::string_const&>
                             ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                               *)emitted,&name);
          if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            bVar8 = cmGeneratorTarget::IsInBuildSystem
                              ((cmGeneratorTarget *)
                               (puVar15->_M_t).
                               super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                              );
            if (bVar8) {
              TVar9 = cmGeneratorTarget::GetType
                                ((cmGeneratorTarget *)
                                 (puVar15->_M_t).
                                 super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                );
              if (TVar9 != GLOBAL_TARGET) {
                cmLocalUnixMakefileGenerator3::WriteDivider(local_178,local_170);
                std::__ostream_insert<char,std::char_traits<char>>
                          (local_170,"# Target rules for targets named ",0x21);
                poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                    (local_170,name._M_dataplus._M_p,name._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n\n",2);
                pbVar6 = commands.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                pbVar5 = commands.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (commands.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    commands.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  paVar14 = &(commands.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->field_2;
                  do {
                    plVar4 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(paVar14 + -1))->_M_dataplus)._M_p;
                    if (paVar14 !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)plVar4) {
                      operator_delete(plVar4,paVar14->_M_allocated_capacity + 1);
                    }
                    pbVar13 = (pointer)(paVar14 + 1);
                    paVar14 = paVar14 + 2;
                  } while (pbVar13 != pbVar6);
                  commands.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
                }
                tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&tmp,"CMakeFiles/Makefile2","");
                cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                          ((string *)local_198,local_178,&tmp,&name);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &commands,(string *)local_198);
                if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
                  operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
                }
                pbVar6 = depends.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                pbVar5 = depends.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (depends.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    depends.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  paVar14 = &(depends.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->field_2;
                  do {
                    plVar4 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(paVar14 + -1))->_M_dataplus)._M_p;
                    if (paVar14 !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)plVar4) {
                      operator_delete(plVar4,paVar14->_M_allocated_capacity + 1);
                    }
                    pbVar13 = (pointer)(paVar14 + 1);
                    paVar14 = paVar14 + 2;
                  } while (pbVar13 != pbVar6);
                  depends.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
                }
                if (!bVar7) {
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<char_const(&)[25]>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &depends,(char (*) [25])"cmake_check_build_system");
                }
                cmLocalUnixMakefileGenerator3::WriteMakeRule
                          (local_178,local_170,"Build rule for target.",&name,&depends,&commands,
                           true,false);
                cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                          (&localName,local_178,
                           (cmGeneratorTarget *)
                           (puVar15->_M_t).
                           super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                          );
                makefileName._M_dataplus._M_p = (pointer)&makefileName.field_2;
                makefileName._M_string_length = 0;
                makefileName.field_2._M_local_buf[0] = '\0';
                local_198._0_8_ = localName._M_string_length;
                local_198._8_8_ = localName._M_dataplus._M_p;
                local_198._16_8_ = 0xb;
                local_198._24_8_ = "/build.make";
                views._M_len = 2;
                views._M_array = (iterator)local_198;
                cmCatViews_abi_cxx11_(&makeTargetName,views);
                std::__cxx11::string::operator=((string *)&makefileName,(string *)&makeTargetName);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)makeTargetName._M_dataplus._M_p != &makeTargetName.field_2) {
                  operator_delete(makeTargetName._M_dataplus._M_p,
                                  makeTargetName.field_2._M_allocated_capacity + 1);
                }
                pbVar6 = depends.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                pbVar5 = depends.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (depends.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    depends.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  paVar14 = &(depends.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->field_2;
                  do {
                    plVar4 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(paVar14 + -1))->_M_dataplus)._M_p;
                    if (paVar14 !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)plVar4) {
                      operator_delete(plVar4,paVar14->_M_allocated_capacity + 1);
                    }
                    pbVar13 = (pointer)(paVar14 + 1);
                    paVar14 = paVar14 + 2;
                  } while (pbVar13 != pbVar6);
                  depends.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
                }
                pbVar6 = commands.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                pbVar5 = commands.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (commands.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    commands.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  paVar14 = &(commands.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->field_2;
                  do {
                    plVar4 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(paVar14 + -1))->_M_dataplus)._M_p;
                    if (paVar14 !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)plVar4) {
                      operator_delete(plVar4,paVar14->_M_allocated_capacity + 1);
                    }
                    pbVar13 = (pointer)(paVar14 + 1);
                    paVar14 = paVar14 + 2;
                  } while (pbVar13 != pbVar6);
                  commands.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
                }
                local_198._0_8_ = localName._M_string_length;
                local_198._8_8_ = localName._M_dataplus._M_p;
                local_198._16_8_ = 6;
                local_198._24_8_ = "/build";
                views_00._M_len = 2;
                views_00._M_array = (iterator)local_198;
                cmCatViews_abi_cxx11_(&makeTargetName,views_00);
                local_198._0_8_ = name._M_string_length;
                local_198._8_8_ = name._M_dataplus._M_p;
                local_198._16_8_ = 5;
                local_198._24_8_ = (long)"preinstall/fast" + 10;
                views_01._M_len = 2;
                views_01._M_array = (iterator)local_198;
                cmCatViews_abi_cxx11_(&local_a0,views_01);
                std::__cxx11::string::operator=((string *)&localName,(string *)&local_a0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                  operator_delete(local_a0._M_dataplus._M_p,
                                  local_a0.field_2._M_allocated_capacity + 1);
                }
                cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                          ((string *)local_198,local_178,&makefileName,&makeTargetName);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &commands,(string *)local_198);
                if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
                  operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
                }
                cmLocalUnixMakefileGenerator3::WriteMakeRule
                          (local_178,local_170,"fast build rule for target.",&localName,&depends,
                           &commands,true,false);
                this_00.
                super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>.
                _M_t.
                super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
                     (puVar15->_M_t).
                     super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                ;
                cmLocalUnixMakefileGenerator3::GetConfigName_abi_cxx11_
                          ((string *)local_198,local_178);
                bVar8 = cmGeneratorTarget::NeedRelinkBeforeInstall
                                  ((cmGeneratorTarget *)
                                   this_00.
                                   super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                                   .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,
                                   (string *)local_198);
                if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
                  operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
                }
                if (bVar8) {
                  cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                            (&local_80,local_178,
                             (cmGeneratorTarget *)
                             (puVar15->_M_t).
                             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                            );
                  local_198._0_8_ = local_80._M_string_length;
                  local_198._8_8_ = local_80._M_dataplus._M_p;
                  local_198._16_8_ = 0xb;
                  local_198._24_8_ = "/preinstall";
                  views_02._M_len = 2;
                  views_02._M_array = (iterator)local_198;
                  cmCatViews_abi_cxx11_(&local_a0,views_02);
                  std::__cxx11::string::operator=((string *)&makeTargetName,(string *)&local_a0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                    operator_delete(local_a0._M_dataplus._M_p,
                                    local_a0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_80._M_dataplus._M_p != &local_80.field_2) {
                    operator_delete(local_80._M_dataplus._M_p,
                                    local_80.field_2._M_allocated_capacity + 1);
                  }
                  local_198._0_8_ = name._M_string_length;
                  local_198._8_8_ = name._M_dataplus._M_p;
                  local_198._16_8_ = 0xb;
                  local_198._24_8_ = "/preinstall";
                  views_03._M_len = 2;
                  views_03._M_array = (iterator)local_198;
                  cmCatViews_abi_cxx11_(&local_a0,views_03);
                  std::__cxx11::string::operator=((string *)&localName,(string *)&local_a0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                    operator_delete(local_a0._M_dataplus._M_p,
                                    local_a0.field_2._M_allocated_capacity + 1);
                  }
                  pbVar6 = depends.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  pbVar5 = depends.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  if (depends.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish !=
                      depends.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
                    paVar14 = &(depends.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->field_2;
                    do {
                      plVar4 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)(paVar14 + -1))->_M_dataplus)._M_p;
                      if (paVar14 !=
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)plVar4) {
                        operator_delete(plVar4,paVar14->_M_allocated_capacity + 1);
                      }
                      pbVar13 = (pointer)(paVar14 + 1);
                      paVar14 = paVar14 + 2;
                    } while (pbVar13 != pbVar6);
                    depends.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
                  }
                  pbVar6 = commands.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  pbVar5 = commands.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  if (commands.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish !=
                      commands.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
                    paVar14 = &(commands.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->field_2;
                    do {
                      plVar4 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)(paVar14 + -1))->_M_dataplus)._M_p;
                      if (paVar14 !=
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)plVar4) {
                        operator_delete(plVar4,paVar14->_M_allocated_capacity + 1);
                      }
                      pbVar13 = (pointer)(paVar14 + 1);
                      paVar14 = paVar14 + 2;
                    } while (pbVar13 != pbVar6);
                    commands.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
                  }
                  cmLocalUnixMakefileGenerator3::GetRecursiveMakeCall
                            ((string *)local_198,local_178,&makefileName,&makeTargetName);
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &commands,(string *)local_198);
                  if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
                    operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
                  }
                  cmLocalUnixMakefileGenerator3::WriteMakeRule
                            (local_178,local_170,"Manual pre-install relink rule for target.",
                             &localName,&depends,&commands,true,false);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)makeTargetName._M_dataplus._M_p != &makeTargetName.field_2) {
                  operator_delete(makeTargetName._M_dataplus._M_p,
                                  makeTargetName.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)makefileName._M_dataplus._M_p != &makefileName.field_2) {
                  operator_delete(makefileName._M_dataplus._M_p,
                                  CONCAT71(makefileName.field_2._M_allocated_capacity._1_7_,
                                           makefileName.field_2._M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)localName._M_dataplus._M_p != &localName.field_2) {
                  operator_delete(localName._M_dataplus._M_p,
                                  localName.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)tmp._M_dataplus._M_p != &tmp.field_2) {
                  operator_delete(tmp._M_dataplus._M_p,tmp.field_2._M_allocated_capacity + 1);
                }
              }
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
        }
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 != puVar1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commands);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteConvenienceRules(
  std::ostream& ruleFileStream, std::set<std::string>& emitted)
{
  std::vector<std::string> depends;
  std::vector<std::string> commands;

  bool regenerate = !this->GlobalSettingIsOn("CMAKE_SUPPRESS_REGENERATION");
  if (regenerate) {
    depends.emplace_back("cmake_check_build_system");
  }

  // write the target convenience rules
  for (const auto& localGen : this->LocalGenerators) {
    auto& lg =
      cm::static_reference_cast<cmLocalUnixMakefileGenerator3>(localGen);
    // for each target Generate the rule files for each target.
    for (const auto& gtarget : lg.GetGeneratorTargets()) {
      // Don't emit the same rule twice (e.g. two targets with the same
      // simple name)
      std::string name = gtarget->GetName();
      if (!name.empty() && emitted.insert(name).second &&
          // Handle user targets here.  Global targets are handled in
          // the local generator on a per-directory basis.
          (gtarget->IsInBuildSystem() &&
           gtarget->GetType() != cmStateEnums::GLOBAL_TARGET)) {
        // Add a rule to build the target by name.
        lg.WriteDivider(ruleFileStream);
        ruleFileStream << "# Target rules for targets named " << name
                       << "\n\n";

        // Write the rule.
        commands.clear();
        std::string tmp = "CMakeFiles/Makefile2";
        commands.push_back(lg.GetRecursiveMakeCall(tmp, name));
        depends.clear();
        if (regenerate) {
          depends.emplace_back("cmake_check_build_system");
        }
        lg.WriteMakeRule(ruleFileStream, "Build rule for target.", name,
                         depends, commands, true);

        // Add a fast rule to build the target
        std::string localName = lg.GetRelativeTargetDirectory(gtarget.get());
        std::string makefileName;
        makefileName = cmStrCat(localName, "/build.make");
        depends.clear();
        commands.clear();
        std::string makeTargetName = cmStrCat(localName, "/build");
        localName = cmStrCat(name, "/fast");
        commands.push_back(
          lg.GetRecursiveMakeCall(makefileName, makeTargetName));
        lg.WriteMakeRule(ruleFileStream, "fast build rule for target.",
                         localName, depends, commands, true);

        // Add a local name for the rule to relink the target before
        // installation.
        if (gtarget->NeedRelinkBeforeInstall(lg.GetConfigName())) {
          makeTargetName = cmStrCat(
            lg.GetRelativeTargetDirectory(gtarget.get()), "/preinstall");
          localName = cmStrCat(name, "/preinstall");
          depends.clear();
          commands.clear();
          commands.push_back(
            lg.GetRecursiveMakeCall(makefileName, makeTargetName));
          lg.WriteMakeRule(ruleFileStream,
                           "Manual pre-install relink rule for target.",
                           localName, depends, commands, true);
        }
      }
    }
  }
}